

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_test.cc
# Opt level: O2

int fast_relay_test(int mode)

{
  uint64_t uVar1;
  undefined4 extraout_EDX;
  int __how;
  undefined4 uVar2;
  undefined4 extraout_EDX_00;
  undefined4 extraout_var;
  undefined4 uVar3;
  undefined4 extraout_var_00;
  int __fd;
  ThreadPoolMgr *pTVar4;
  long lVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  FastRelayCtx relay_ctx;
  ThreadPoolMgr mgr;
  undefined1 local_2b8 [32];
  undefined8 local_298;
  FastRelayCtx local_290;
  ThreadPoolMgr local_1f8;
  
  pTVar4 = (ThreadPoolMgr *)local_2b8;
  local_2b8._8_8_ = 100;
  local_2b8._16_2_ = 0x100;
  local_2b8._0_8_ = (_func_int **)0x2;
  if (mode == 1) {
    local_2b8._16_2_ = 0;
  }
  simple_thread_pool::ThreadPoolMgr::ThreadPoolMgr(&local_1f8);
  simple_thread_pool::ThreadPoolMgr::init(&local_1f8,(EVP_PKEY_CTX *)local_2b8);
  TestSuite::_msgt("begin\n");
  local_298._0_1_ = false;
  local_298._1_1_ = false;
  local_298._2_6_ = 0;
  local_2b8._24_8_ = std::chrono::_V2::system_clock::now();
  FastRelayCtx::FastRelayCtx(&local_290);
  if (mode == 0) {
    local_290.asyncScheduleNext = false;
    lVar5 = 1000000;
    uVar2 = extraout_EDX;
    uVar3 = extraout_var;
    while( true ) {
      __fd = (int)pTVar4;
      bVar6 = lVar5 == 0;
      lVar5 = lVar5 + -1;
      if (bVar6) break;
      pTVar4 = &local_1f8;
      fast_relay_func(&local_290,&local_1f8,(TaskResult *)CONCAT44(uVar3,uVar2));
      uVar2 = extraout_EDX_00;
      uVar3 = extraout_var_00;
    }
  }
  else {
    fast_relay_func(&local_290,&local_1f8,(TaskResult *)CONCAT44(extraout_var,extraout_EDX));
    __fd = 3000000;
    simple_thread_pool::EventAwaiter::wait_us(&local_290.ea,3000000);
  }
  uVar1 = TestSuite::Timer::getTimeUs((Timer *)(local_2b8 + 0x18));
  auVar7._8_4_ = (int)(local_290.storage._M_t._M_impl.super__Rb_tree_header._M_node_count >> 0x20);
  auVar7._0_8_ = local_290.storage._M_t._M_impl.super__Rb_tree_header._M_node_count;
  auVar7._12_4_ = 0x45300000;
  auVar8._8_4_ = (int)(uVar1 >> 0x20);
  auVar8._0_8_ = uVar1;
  auVar8._12_4_ = 0x45300000;
  TestSuite::_msgt("%.1f executions/s",
                   (((auVar7._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,
                                      (int)local_290.storage._M_t._M_impl.super__Rb_tree_header.
                                           _M_node_count) - 4503599627370496.0)) * 1000000.0) /
                   ((auVar8._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)));
  simple_thread_pool::ThreadPoolMgr::shutdown(&local_1f8,__fd,__how);
  FastRelayCtx::~FastRelayCtx(&local_290);
  simple_thread_pool::ThreadPoolMgr::~ThreadPoolMgr(&local_1f8);
  return 0;
}

Assistant:

int fast_relay_test(int mode) {
    ThreadPoolOptions opt;
    opt.numInitialThreads = 2;
    if (mode == 1) {
        opt.activeWorkerMode = false;
    } else if (mode == 2) {
        opt.activeWorkerMode = true;
    }

    // Initialize thread pool.
    ThreadPoolMgr mgr;
    mgr.init(opt);

    TestSuite::_msgt("begin\n");
    TestSuite::Timer tt;

    FastRelayCtx relay_ctx;
    if (mode == 0) {
        relay_ctx.asyncScheduleNext = false;
        for (size_t ii = 0; ii < 1000000; ++ii) {
            fast_relay_func(&relay_ctx, &mgr, TaskResult());
        }
    } else {
        // Fire timer task.
        fast_relay_func(&relay_ctx, &mgr, TaskResult());
        // Wait 3 seconds.
        relay_ctx.ea.wait_ms(3000);
    }

    uint64_t elapsed_us = tt.getTimeUs();
    TestSuite::_msgt("%.1f executions/s",
                     relay_ctx.storage.size() * 1000000.0 / elapsed_us);

    // Shutdown thread pool.
    mgr.shutdown();
    return 0;
}